

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>_>
::val(FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>_>
      *this)

{
  double dVar1;
  FadExpr<FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
  *pFVar2;
  FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *pFVar3;
  FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *pFVar4;
  double dVar5;
  double dVar6;
  
  dVar1 = (this->left_).constant_;
  pFVar2 = this->right_;
  pFVar3 = (pFVar2->fadexpr_).left_;
  dVar5 = exp((pFVar3->fadexpr_).expr_.fadexpr_.left_.constant_ *
              ((pFVar3->fadexpr_).expr_.fadexpr_.right_)->val_);
  pFVar4 = (pFVar2->fadexpr_).right_;
  dVar6 = cos((pFVar4->fadexpr_).expr_.fadexpr_.left_.constant_ *
              ((pFVar4->fadexpr_).expr_.fadexpr_.right_)->val_);
  return dVar1 - dVar6 * dVar5;
}

Assistant:

const value_type val() const {return left_.val() - right_.val();}